

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffnchk(fitsfile *fptr,int *status)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  FITSfile *pFVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  char block [2881];
  
  iVar6 = *status;
  if (iVar6 < 1) {
    pFVar4 = fptr->Fptr;
    if (fptr->HDUposition != pFVar4->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      pFVar4 = fptr->Fptr;
    }
    if (pFVar4->datastart == -1) {
      iVar6 = 0;
    }
    else {
      lVar2 = (pFVar4->datastart - pFVar4->headstart[pFVar4->curhdu]) / 0xb40;
      iVar6 = 0;
      ffmbyt(fptr,pFVar4->headstart[pFVar4->curhdu],0,status);
      block[0xb40] = '\0';
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      iVar5 = -1;
      while (bVar7 = lVar2 != 0, lVar2 = lVar2 + -1, bVar7) {
        iVar1 = ffgbyt(fptr,0xb40,block,status);
        if (0 < iVar1) {
          return 0;
        }
        sVar3 = strlen(block);
        if ((int)sVar3 != 0xb40) {
          return (int)sVar3 - iVar5;
        }
        iVar5 = iVar5 + -0xb40;
      }
    }
  }
  return iVar6;
}

Assistant:

int ffnchk(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *status)     /* IO - error status                         */
/*
  function returns the position of the first null character (ASCII 0), if
  any, in the current header.  Null characters are illegal, but the other
  CFITSIO routines that read the header will not detect this error, because
  the null gets interpreted as a normal end of string character.
*/
{
    long ii, nblock;
    LONGLONG bytepos;
    int length, nullpos;
    char block[2881];
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        return(0);  /* Don't check a file that is just being created.  */
                    /* It cannot contain nulls since CFITSIO wrote it. */
    }
    else
    {
        /* calculate number of blocks in the header */
        nblock = (long) (( (fptr->Fptr)->datastart - 
                   (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);
    }

    bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    block[2880] = '\0';
    for (ii = 0; ii < nblock; ii++)
    {
        if (ffgbyt(fptr, 2880, block, status) > 0)
            return(0);   /* read error of some sort */

        length = strlen(block);
        if (length != 2880)
        {
            nullpos = (ii * 2880) + length + 1;
            return(nullpos);
        }
    }

    return(0);
}